

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<12,_2,_9,_2,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float fVar1;
  float fVar2;
  int i;
  float *pfVar3;
  long lVar4;
  int row;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  undefined1 auVar10 [16];
  undefined4 uVar11;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Mat3 m;
  Mat3 m_1;
  float afStack_b0 [6];
  float local_98 [2];
  undefined8 local_90;
  undefined4 local_88;
  Matrix<float,_3,_3> local_80;
  Matrix<float,_3,_3> local_5c;
  Matrix<float,_3,_3> local_38;
  long lVar8;
  
  pfVar3 = (float *)&local_80;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    auVar7 = _DAT_00632fe0;
    do {
      bVar9 = SUB164(auVar7 ^ _DAT_00625ae0,4) == -0x80000000 &&
              SUB164(auVar7 ^ _DAT_00625ae0,0) < -0x7ffffffd;
      if (bVar9) {
        uVar11 = 0x3f800000;
        if (lVar4 != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar6) = uVar11;
      }
      if (bVar9) {
        uVar11 = 0x3f800000;
        if (lVar4 + -0xc != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar6 + 0xc) = uVar11;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0xc;
    pfVar3 = pfVar3 + 1;
  } while (lVar5 != 3);
  local_80.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
  local_80.m_data.m_data[0].m_data._4_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 1);
  fVar1 = evalCtx->in[0].m_data[0];
  fVar2 = evalCtx->in[0].m_data[1];
  local_80.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  local_80.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  local_80.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  local_80.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  pfVar3 = (float *)&local_38;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    auVar10 = _DAT_00632fe0;
    do {
      bVar9 = SUB164(auVar10 ^ _DAT_00625ae0,4) == -0x80000000 &&
              SUB164(auVar10 ^ _DAT_00625ae0,0) < -0x7ffffffd;
      if (bVar9) {
        uVar11 = 0x3f800000;
        if (lVar4 != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar6) = uVar11;
      }
      if (bVar9) {
        uVar11 = 0x3f800000;
        if (lVar4 + -0xc != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar6 + 0xc) = uVar11;
      }
      lVar8 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar8 + 2;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0xc;
    pfVar3 = pfVar3 + 1;
  } while (lVar5 != 3);
  local_38.m_data.m_data[0].m_data[2] = local_80.m_data.m_data[0].m_data[2];
  afStack_b0[0] = 4.434419e-39;
  afStack_b0[1] = 0.0;
  local_38.m_data.m_data[0].m_data[0] = fVar1;
  local_38.m_data.m_data[0].m_data[1] = fVar2;
  local_38.m_data.m_data[1].m_data[0] = local_80.m_data.m_data[1].m_data[0];
  local_38.m_data.m_data[1].m_data._4_8_ = local_80.m_data.m_data[1].m_data._4_8_;
  local_38.m_data.m_data[2].m_data._0_8_ = local_80.m_data.m_data[2].m_data._0_8_;
  local_38.m_data.m_data[2].m_data[2] = local_80.m_data.m_data[2].m_data[2];
  tcu::operator-(&local_5c,&local_80,&local_38);
  local_90 = (ulong)local_90._4_4_ << 0x20;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  lVar4 = 0;
  do {
    local_98[lVar4] =
         local_5c.m_data.m_data[0].m_data[lVar4] + local_5c.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  afStack_b0[4] = 0.0;
  afStack_b0[2] = 0.0;
  afStack_b0[3] = 0.0;
  lVar4 = 0;
  do {
    afStack_b0[lVar4 + 2] =
         local_98[lVar4] + *(float *)((long)(local_38.m_data.m_data + -1) + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_90 = 0x100000000;
  local_88 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_98[lVar4]] = afStack_b0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) - getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}